

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TryTableExpr::~TryTableExpr(TryTableExpr *this)

{
  TryTableExpr *this_local;
  
  ~TryTableExpr(this);
  operator_delete(this,0x130);
  return;
}

Assistant:

explicit TryTableExpr(const Location& loc = Location())
      : ExprMixin<ExprType::TryTable>(loc) {}